

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

int x86CPUInfo(CPUFeature feature)

{
  byte *pbVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t i;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint in_XCR0;
  
  puVar2 = (uint *)cpuid_basic_info(0);
  uVar4 = *puVar2;
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar9 = 0;
    puVar3 = (uint *)cpuid_Version_info(1);
    uVar5 = *puVar3;
    uVar7 = puVar3[3];
    uVar10 = 0;
    switch(feature) {
    case kSSE2:
      uVar10 = puVar3[2] >> 0x1a & 1;
      break;
    case kSlowSSSE3:
      uVar10 = uVar9;
      if (((uVar7 >> 9 & 1) != 0 &&
           (puVar2[2] == 0x49656e69 && (puVar2[3] == 0x6c65746e && puVar2[1] == 0x756e6547))) &&
         ((uVar5 & 0xf00) == 0x600)) {
        lVar8 = 0;
        do {
          if (lVar8 == 6) {
            return 0;
          }
          pbVar1 = &CheckSlowModel_kSlowModels + lVar8;
          lVar8 = lVar8 + 1;
          uVar10 = 1;
        } while ((uVar5 >> 4 & 0xf | uVar5 >> 0xc & 0xf0) != (uint)*pbVar1);
      }
      break;
    case kSSE4_1:
      uVar7 = uVar7 >> 0x13;
    case kSSE3:
      uVar10 = uVar7 & 1;
      break;
    case kAVX:
      uVar10 = uVar9;
      if ((~uVar7 & 0x18000000) == 0) {
        uVar10 = (uint)((~in_XCR0 & 6) == 0);
      }
      break;
    case kAVX2:
      iVar6 = x86CPUInfo(kAVX);
      if ((6 < uVar4) && (uVar10 = uVar9, iVar6 != 0)) {
        lVar8 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar10 = *(uint *)(lVar8 + 4) >> 5 & 1;
      }
    }
  }
  return uVar10;
}

Assistant:

static int x86CPUInfo(CPUFeature feature) {
  int max_cpuid_value;
  int cpu_info[4];
  int is_intel = 0;

  // get the highest feature value cpuid supports
  GetCPUInfo(cpu_info, 0);
  max_cpuid_value = cpu_info[0];
  if (max_cpuid_value < 1) {
    return 0;
  } else {
    const int VENDOR_ID_INTEL_EBX = 0x756e6547;  // uneG
    const int VENDOR_ID_INTEL_EDX = 0x49656e69;  // Ieni
    const int VENDOR_ID_INTEL_ECX = 0x6c65746e;  // letn
    is_intel = (cpu_info[1] == VENDOR_ID_INTEL_EBX &&
                cpu_info[2] == VENDOR_ID_INTEL_ECX &&
                cpu_info[3] == VENDOR_ID_INTEL_EDX);    // genuine Intel?
  }

  GetCPUInfo(cpu_info, 1);
  if (feature == kSSE2) {
    return !!(cpu_info[3] & (1 << 26));
  }
  if (feature == kSSE3) {
    return !!(cpu_info[2] & (1 << 0));
  }
  if (feature == kSlowSSSE3) {
    if (is_intel && (cpu_info[2] & (1 << 9))) {   // SSSE3?
      return CheckSlowModel(cpu_info[0]);
    }
    return 0;
  }

  if (feature == kSSE4_1) {
    return !!(cpu_info[2] & (1 << 19));
  }
  if (feature == kAVX) {
    // bits 27 (OSXSAVE) & 28 (256-bit AVX)
    if ((cpu_info[2] & 0x18000000) == 0x18000000) {
      // XMM state and YMM state enabled by the OS.
      return (xgetbv() & 0x6) == 0x6;
    }
  }
  if (feature == kAVX2) {
    if (x86CPUInfo(kAVX) && max_cpuid_value >= 7) {
      GetCPUInfo(cpu_info, 7);
      return !!(cpu_info[1] & (1 << 5));
    }
  }
  return 0;
}